

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_roi_resize
                (uchar *pixels,int type,int w,int h,int stride,int roix,int roiy,int roiw,int roih,
                int target_width,int target_height,Allocator *allocator)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  Mat *in_RDI;
  int in_R8D;
  uint in_stack_00000008;
  uint in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  int type_from;
  int in_stack_00000158;
  int in_stack_0000015c;
  int in_stack_00000160;
  int in_stack_00000164;
  uchar *in_stack_00000168;
  int in_stack_000002f0;
  int in_stack_000002f8;
  Allocator *in_stack_00000300;
  
  if ((((((int)in_stack_00000008 < 0) || ((int)in_stack_00000010 < 0)) ||
       ((int)in_stack_00000018 < 1)) ||
      (((int)in_stack_00000020 < 1 || (in_ECX < (int)(in_stack_00000008 + in_stack_00000018))))) ||
     (in_R8D < (int)(in_stack_00000010 + in_stack_00000020))) {
    fprintf(_stderr,"roi %d %d %d %d out of image %d %d",(ulong)in_stack_00000008,
            (ulong)in_stack_00000010,(ulong)in_stack_00000018,(ulong)in_stack_00000020);
    fprintf(_stderr,"\n");
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  else {
    uVar1 = in_EDX & 0xffff;
    if ((uVar1 == 1) || (uVar1 == 2)) {
      from_pixels_resize(in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
                         in_stack_00000158,in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
    }
    else if (uVar1 == 3) {
      from_pixels_resize(in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
                         in_stack_00000158,in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
    }
    else if ((uVar1 == 4) || (uVar1 == 5)) {
      from_pixels_resize(in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_0000015c,
                         in_stack_00000158,in_stack_000002f0,in_stack_000002f8,in_stack_00000300);
    }
    else {
      fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
      fprintf(_stderr,"\n");
      in_RDI->data = (void *)0x0;
      in_RDI->refcount = (int *)0x0;
      in_RDI->elemsize = 0;
      in_RDI->elempack = 0;
      in_RDI->allocator = (Allocator *)0x0;
      in_RDI->dims = 0;
      in_RDI->w = 0;
      in_RDI->h = 0;
      in_RDI->d = 0;
      in_RDI->c = 0;
      in_RDI->cstep = 0;
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_roi_resize(const unsigned char* pixels, int type, int w, int h, int stride, int roix, int roiy, int roiw, int roih, int target_width, int target_height, Allocator* allocator)
{
    if (roix < 0 || roiy < 0 || roiw <= 0 || roih <= 0 || roix + roiw > w || roiy + roih > h)
    {
        NCNN_LOGE("roi %d %d %d %d out of image %d %d", roix, roiy, roiw, roih, w, h);
        return Mat();
    }

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return from_pixels_resize(pixels + roiy * stride + roix * 3, type, roiw, roih, stride, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return from_pixels_resize(pixels + roiy * stride + roix * 1, type, roiw, roih, stride, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return from_pixels_resize(pixels + roiy * stride + roix * 4, type, roiw, roih, stride, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}